

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_deep_copy_non_container
          (t_java_generator *this,ostream *out,string *source_name,string dest_name,t_type *type)

{
  int iVar1;
  t_type *ttype;
  ostream *poVar2;
  t_type *in_R8;
  string local_48;
  
  ttype = t_type::get_true_type(in_R8);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[9])(ttype);
      if ((char)iVar1 == '\0') {
        poVar2 = std::operator<<(out,"new ");
        type_name_abi_cxx11_(&local_48,this,ttype,true,true,false,false);
        poVar2 = std::operator<<(poVar2,(string *)&local_48);
        poVar2 = std::operator<<(poVar2,"(");
        poVar2 = std::operator<<(poVar2,(string *)source_name);
        std::operator<<(poVar2,")");
        std::__cxx11::string::~string((string *)&local_48);
        return;
      }
    }
  }
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
  if ((char)iVar1 != '\0') {
    poVar2 = std::operator<<(out,"org.apache.thrift.TBaseHelper.copyBinary(");
    poVar2 = std::operator<<(poVar2,(string *)source_name);
    std::operator<<(poVar2,")");
    return;
  }
  std::operator<<(out,(string *)source_name);
  return;
}

Assistant:

void t_java_generator::generate_deep_copy_non_container(ostream& out,
                                                        std::string source_name,
                                                        std::string dest_name,
                                                        t_type* type) {
  (void)dest_name;
  type = get_true_type(type);
  if (type->is_base_type() || type->is_enum() || type->is_typedef()) {
    if (type->is_binary()) {
      out << "org.apache.thrift.TBaseHelper.copyBinary(" << source_name << ")";
    } else {
      // everything else can be copied directly
      out << source_name;
    }
  } else {
    out << "new " << type_name(type, true, true) << "(" << source_name << ")";
  }
}